

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsRandomShaderCase.cpp
# Opt level: O0

void __thiscall
deqp::gls::RandomShaderCase::checkShaderLimits(RandomShaderCase *this,Shader *shader)

{
  Type TVar1;
  int iVar2;
  vector<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_> *uniforms;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestError *this_00;
  NotSupportedError *this_01;
  Enum<int,_2UL> EVar3;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_99;
  GetNameFunc local_98;
  int local_90;
  GetNameFunc local_78;
  int local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  int local_24;
  GLenum error;
  int numSupported;
  GLenum pname;
  int numRequiredSamplers;
  Shader *shader_local;
  RandomShaderCase *this_local;
  
  _pname = shader;
  shader_local = (Shader *)this;
  uniforms = rsg::Shader::getUniforms(shader);
  numSupported = getNumSamplerUniforms(uniforms);
  if (0 < numSupported) {
    TVar1 = rsg::Shader::getType(_pname);
    error = 0x8872;
    if (TVar1 == TYPE_VERTEX) {
      error = 0x8b4c;
    }
    local_24 = -1;
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar2) + 0x868))(error,&local_24);
    iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
    local_28 = (**(code **)(CONCAT44(extraout_var_00,iVar2) + 0x800))();
    if (local_28 != 0) {
      local_99 = 1;
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      EVar3 = glu::getErrorStr(local_28);
      local_98 = EVar3.m_getName;
      local_90 = EVar3.m_value;
      local_78 = local_98;
      local_70 = local_90;
      de::toString<tcu::Format::Enum<int,2ul>>(&local_68,(de *)&local_78,EVar3._8_8_);
      std::operator+(&local_48,"Limit query failed: ",&local_68);
      tcu::TestError::TestError(this_00,&local_48);
      local_99 = 0;
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if (local_24 < numSupported) {
      this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      de::toString<int>(&local_120,&numSupported);
      std::operator+(&local_100,"Shader requires ",&local_120);
      std::operator+(&local_e0,&local_100," sampler(s). Implementation supports ");
      de::toString<int>(&local_140,&local_24);
      std::operator+(&local_c0,&local_e0,&local_140);
      tcu::NotSupportedError::NotSupportedError(this_01,&local_c0);
      __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  return;
}

Assistant:

void RandomShaderCase::checkShaderLimits (const rsg::Shader& shader) const
{
	const int numRequiredSamplers = getNumSamplerUniforms(shader.getUniforms());

	if (numRequiredSamplers > 0)
	{
		const GLenum	pname			= (shader.getType() == rsg::Shader::TYPE_VERTEX) ? (GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS) : (GL_MAX_TEXTURE_IMAGE_UNITS);
		int				numSupported	= -1;
		GLenum			error;

		m_renderCtx.getFunctions().getIntegerv(pname, &numSupported);
		error = m_renderCtx.getFunctions().getError();

		if (error != GL_NO_ERROR)
			throw tcu::TestError("Limit query failed: " + de::toString(glu::getErrorStr(error)));

		if (numSupported < numRequiredSamplers)
			throw tcu::NotSupportedError("Shader requires " + de::toString(numRequiredSamplers) + " sampler(s). Implementation supports " + de::toString(numSupported));
	}
}